

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void rc_spatial_act_onepass_rt(AV1_COMP *cpi,uint8_t *src_y,int src_ystride)

{
  uint uVar1;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  uint var;
  uint sse;
  int sbi_col;
  int sbi_row;
  int sb_rows;
  int sb_cols;
  int sb_size_by_mb;
  int num_zero_var_blocks;
  int num_samples;
  uint64_t avg_variance;
  BLOCK_SIZE bsize;
  int num_mi_rows;
  int num_mi_cols;
  AV1_COMMON *cm;
  int local_60;
  undefined1 local_58 [4];
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  ulong local_38;
  undefined1 local_29;
  int local_28;
  int local_24;
  long *local_20;
  int local_14;
  long local_10;
  long *local_8;
  
  local_20 = in_RDI + 0x77f0;
  local_24 = (int)in_RDI[0x7833];
  local_28 = *(int *)((long)in_RDI + 0x3c194);
  local_29 = 0xc;
  local_38 = 0;
  local_3c = 0;
  local_40 = 0;
  *(undefined4 *)(in_RDI + 0xc0fd) = 0;
  if (*(char *)(in_RDI[0x8401] + 0x1c) == '\x0f') {
    local_60 = *(int *)(in_RDI[0x8401] + 0x20) >> 1;
  }
  else {
    local_60 = *(int *)(in_RDI[0x8401] + 0x20);
  }
  local_44 = local_60;
  local_48 = (local_24 + local_60 + -1) / local_60;
  local_4c = (local_28 + local_60 + -1) / local_60;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_50 = 0; local_50 < local_4c; local_50 = local_50 + 1) {
    for (local_54 = 0; local_54 < local_48; local_54 = local_54 + 1) {
      uVar1 = (**(code **)(*local_8 + 0xce58))(local_10,local_14,AV1_VAR_OFFS,0,local_58);
      local_38 = uVar1 + local_38;
      local_3c = local_3c + 1;
      if (uVar1 == 0) {
        local_40 = local_40 + 1;
      }
      local_10 = local_10 + 0x40;
    }
    local_10 = local_10 + (local_14 * 0x40 + local_48 * -0x40);
  }
  if (0 < local_3c) {
    *(int *)(local_8 + 0xc0fd) = (local_40 * 100) / local_3c;
    local_38 = local_38 / (ulong)(long)local_3c;
  }
  local_8[0xc0fa] = local_38 >> 0xc;
  return;
}

Assistant:

static void rc_spatial_act_onepass_rt(AV1_COMP *cpi, uint8_t *src_y,
                                      int src_ystride) {
  AV1_COMMON *const cm = &cpi->common;
  int num_mi_cols = cm->mi_params.mi_cols;
  int num_mi_rows = cm->mi_params.mi_rows;
  const BLOCK_SIZE bsize = BLOCK_64X64;
  // Loop over sub-sample of frame, compute average over 64x64 blocks.
  uint64_t avg_variance = 0;
  int num_samples = 0;
  int num_zero_var_blocks = 0;
  cpi->rc.perc_spatial_flat_blocks = 0;
  const int sb_size_by_mb = (cm->seq_params->sb_size == BLOCK_128X128)
                                ? (cm->seq_params->mib_size >> 1)
                                : cm->seq_params->mib_size;
  const int sb_cols = (num_mi_cols + sb_size_by_mb - 1) / sb_size_by_mb;
  const int sb_rows = (num_mi_rows + sb_size_by_mb - 1) / sb_size_by_mb;
  for (int sbi_row = 0; sbi_row < sb_rows; ++sbi_row) {
    for (int sbi_col = 0; sbi_col < sb_cols; ++sbi_col) {
      unsigned int sse;
      const unsigned int var =
          cpi->ppi->fn_ptr[bsize].vf(src_y, src_ystride, AV1_VAR_OFFS, 0, &sse);
      avg_variance += var;
      num_samples++;
      if (var == 0) num_zero_var_blocks++;
      src_y += 64;
    }
    src_y += (src_ystride << 6) - (sb_cols << 6);
  }
  if (num_samples > 0) {
    cpi->rc.perc_spatial_flat_blocks = 100 * num_zero_var_blocks / num_samples;
    avg_variance = avg_variance / num_samples;
  }
  cpi->rc.frame_spatial_variance = avg_variance >> 12;
}